

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb_sse2.c
# Opt level: O0

void get_8_coeff_contexts_ver(uint8_t *levels,int width,ptrdiff_t *offsets,int8_t *coeff_contexts)

{
  undefined8 *in_RCX;
  int in_ESI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  __m128i level [5];
  __m128i count;
  int col;
  __m128i pos_to_offset;
  int stride;
  __m128i *in_stack_fffffffffffffe98;
  undefined6 in_stack_fffffffffffffea0;
  undefined1 uVar1;
  undefined1 uVar2;
  int in_stack_fffffffffffffeac;
  uint8_t *in_stack_fffffffffffffeb0;
  undefined8 local_108;
  undefined8 uStack_100;
  int local_ec;
  undefined8 *local_c8;
  char local_88;
  char cStack_87;
  char cStack_86;
  char cStack_85;
  char cStack_84;
  char cStack_83;
  char cStack_82;
  char cStack_81;
  char cStack_80;
  char cStack_7f;
  char cStack_7e;
  char cStack_7d;
  char cStack_7c;
  char cStack_7b;
  char cStack_7a;
  char cStack_79;
  
  uVar1 = 0x24;
  uVar2 = 0x1a;
  local_ec = in_ESI;
  local_c8 = in_RCX;
  do {
    load_levels_8x2x5_sse2
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffeac,
               (ptrdiff_t *)CONCAT17(uVar2,CONCAT16(uVar1,in_stack_fffffffffffffea0)),
               in_stack_fffffffffffffe98);
    get_coeff_contexts_kernel_sse2((__m128i *)&stack0xfffffffffffffea8);
    local_88 = (char)extraout_XMM0_Qa;
    cStack_87 = (char)((ulong)extraout_XMM0_Qa >> 8);
    cStack_86 = (char)((ulong)extraout_XMM0_Qa >> 0x10);
    cStack_85 = (char)((ulong)extraout_XMM0_Qa >> 0x18);
    cStack_84 = (char)((ulong)extraout_XMM0_Qa >> 0x20);
    cStack_83 = (char)((ulong)extraout_XMM0_Qa >> 0x28);
    cStack_82 = (char)((ulong)extraout_XMM0_Qa >> 0x30);
    cStack_81 = (char)((ulong)extraout_XMM0_Qa >> 0x38);
    cStack_80 = (char)extraout_XMM0_Qb;
    cStack_7f = (char)((ulong)extraout_XMM0_Qb >> 8);
    cStack_7e = (char)((ulong)extraout_XMM0_Qb >> 0x10);
    cStack_7d = (char)((ulong)extraout_XMM0_Qb >> 0x18);
    cStack_7c = (char)((ulong)extraout_XMM0_Qb >> 0x20);
    cStack_7b = (char)((ulong)extraout_XMM0_Qb >> 0x28);
    cStack_7a = (char)((ulong)extraout_XMM0_Qb >> 0x30);
    cStack_79 = (char)((ulong)extraout_XMM0_Qb >> 0x38);
    local_108 = CONCAT17(cStack_81 + '$',
                         CONCAT16(cStack_82 + '$',
                                  CONCAT15(cStack_83 + '$',
                                           CONCAT14(cStack_84 + '$',
                                                    CONCAT13(cStack_85 + '$',
                                                             CONCAT12(cStack_86 + '$',
                                                                      CONCAT11(cStack_87 + '\x1f',
                                                                               local_88 + '\x1a'))))
                                          )));
    uStack_100 = CONCAT17(cStack_79 + '$',
                          CONCAT16(cStack_7a + '$',
                                   CONCAT15(cStack_7b + '$',
                                            CONCAT14(cStack_7c + '$',
                                                     CONCAT13(cStack_7d + '$',
                                                              CONCAT12(cStack_7e + '$',
                                                                       CONCAT11(cStack_7f + '\x1f',
                                                                                cStack_80 + '\x1a'))
                                                             )))));
    *local_c8 = local_108;
    local_c8[1] = uStack_100;
    local_c8 = local_c8 + 2;
    local_ec = local_ec + -2;
  } while (local_ec != 0);
  return;
}

Assistant:

static inline void get_8_coeff_contexts_ver(const uint8_t *levels,
                                            const int width,
                                            const ptrdiff_t *const offsets,
                                            int8_t *coeff_contexts) {
  const int stride = 8 + TX_PAD_HOR;
  const __m128i pos_to_offset =
      _mm_setr_epi8(SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 5,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 0, SIG_COEF_CONTEXTS_2D + 5,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10,
                    SIG_COEF_CONTEXTS_2D + 10, SIG_COEF_CONTEXTS_2D + 10);
  int col = width;
  __m128i count;
  __m128i level[5];

  assert(!(width % 2));

  do {
    load_levels_8x2x5_sse2(levels, stride, offsets, level);
    count = get_coeff_contexts_kernel_sse2(level);
    count = _mm_add_epi8(count, pos_to_offset);
    _mm_store_si128((__m128i *)coeff_contexts, count);
    levels += 2 * stride;
    coeff_contexts += 16;
    col -= 2;
  } while (col);
}